

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O1

Ref_Man_t * Dar_ManRefStart(Aig_Man_t *pAig,Dar_RefPar_t *pPars)

{
  int iVar1;
  undefined4 uVar2;
  void *pvVar3;
  int iVar4;
  Ref_Man_t *__s;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  undefined8 *puVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  uint uVar13;
  void **ppvVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  
  __s = (Ref_Man_t *)malloc(0xa0);
  ppvVar6 = (void **)0x0;
  memset(__s,0,0xa0);
  __s->pAig = pAig;
  __s->pPars = pPars;
  uVar17 = pPars->nCutsMax;
  pVVar5 = (Vec_Vec_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar17 - 1) {
    uVar13 = uVar17;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = uVar13;
  if (uVar13 != 0) {
    ppvVar6 = (void **)malloc((long)(int)uVar13 << 3);
  }
  pVVar5->pArray = ppvVar6;
  if (0 < (int)uVar17) {
    uVar18 = 0;
    do {
      puVar7 = (undefined8 *)malloc(0x10);
      *puVar7 = 0;
      puVar7[1] = 0;
      ppvVar6[uVar18] = puVar7;
      uVar18 = uVar18 + 1;
    } while (uVar17 != uVar18);
  }
  pVVar5->nSize = uVar17;
  __s->vCuts = pVVar5;
  iVar1 = pPars->nLeafMax;
  uVar18 = (ulong)iVar1;
  uVar17 = 1 << ((char)iVar1 - 5U & 0x1f);
  if ((long)uVar18 < 6) {
    uVar17 = 1;
  }
  ppvVar6 = (void **)malloc(((long)(int)uVar17 * 4 + 8) * uVar18);
  if (0 < (long)uVar18) {
    ppvVar8 = ppvVar6 + uVar18;
    ppvVar14 = ppvVar6;
    uVar16 = uVar18;
    do {
      *ppvVar14 = ppvVar8;
      ppvVar14 = ppvVar14 + 1;
      ppvVar8 = (void **)((long)ppvVar8 + (long)(int)uVar17 * 4);
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nSize = iVar1;
  pVVar9->nCap = iVar1;
  pVVar9->pArray = ppvVar6;
  if (0 < iVar1) {
    uVar16 = 0;
    do {
      pvVar3 = ppvVar6[uVar16];
      if (uVar16 < 5) {
        if (0 < (int)uVar17) {
          uVar2 = (&DAT_008dccd0)[uVar16];
          uVar19 = 0;
          do {
            *(undefined4 *)((long)pvVar3 + uVar19 * 4) = uVar2;
            uVar19 = uVar19 + 1;
          } while (uVar17 != uVar19);
        }
      }
      else if (0 < (int)uVar17) {
        uVar19 = 0;
        do {
          *(uint *)((long)pvVar3 + uVar19 * 4) =
               -(uint)((1 << ((char)uVar16 - 5U & 0x1f) & (uint)uVar19) != 0);
          uVar19 = uVar19 + 1;
        } while (uVar17 != uVar19);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar18);
  }
  __s->vTruthElem = pVVar9;
  iVar1 = pPars->nLeafMax;
  iVar4 = 1 << ((char)iVar1 - 5U & 0x1f);
  if (iVar1 < 6) {
    iVar4 = 1;
  }
  ppvVar6 = (void **)malloc((long)iVar4 * 0x1000 + 0x2000);
  lVar10 = 0x2000;
  lVar15 = 0;
  do {
    ppvVar6[lVar15] = (void *)((long)ppvVar6 + lVar10);
    lVar15 = lVar15 + 1;
    lVar10 = lVar10 + (long)iVar4 * 4;
  } while (lVar15 != 0x400);
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 0x400;
  pVVar9->nSize = 0x400;
  pVVar9->pArray = ppvVar6;
  __s->vTruthStore = pVVar9;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 0x10000;
  pVVar11->nSize = 0;
  piVar12 = (int *)malloc(0x40000);
  pVVar11->pArray = piVar12;
  __s->vMemory = pVVar11;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 0x100;
  pVVar9->nSize = 0;
  ppvVar6 = (void **)malloc(0x800);
  pVVar9->pArray = ppvVar6;
  __s->vCutNodes = pVVar9;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar4;
  if (iVar4 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar4 << 3);
  }
  pVVar9->pArray = ppvVar6;
  __s->vLeavesBest = pVVar9;
  (__s->DecPars).nVarsMax = iVar1;
  (__s->DecPars).fVerbose = pPars->fVerbose;
  (__s->DecPars).fVeryVerbose = 0;
  return __s;
}

Assistant:

Ref_Man_t * Dar_ManRefStart( Aig_Man_t * pAig, Dar_RefPar_t * pPars )
{
    Ref_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Ref_Man_t, 1 );
    memset( p, 0, sizeof(Ref_Man_t) );
    p->pAig         = pAig;
    p->pPars        = pPars;
    // other data
    p->vCuts        = Vec_VecStart( pPars->nCutsMax );
    p->vTruthElem   = Vec_PtrAllocTruthTables( pPars->nLeafMax );
    p->vTruthStore  = Vec_PtrAllocSimInfo( 1024, Kit_TruthWordNum(pPars->nLeafMax) );
    p->vMemory      = Vec_IntAlloc( 1 << 16 );
    p->vCutNodes    = Vec_PtrAlloc( 256 );
    p->vLeavesBest  = Vec_PtrAlloc( pPars->nLeafMax );
    // alloc bi-decomposition manager
    p->DecPars.nVarsMax = pPars->nLeafMax;
    p->DecPars.fVerbose = pPars->fVerbose;
    p->DecPars.fVeryVerbose = 0;
//    p->pManDec = Bdc_ManAlloc( &p->DecPars );
    return p;
}